

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

void asio::detail::
     reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RDI;
  fenced_block b;
  binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_std::error_code,_unsigned_long>
  handler;
  handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
  w;
  ptr p;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor>
  *o;
  undefined4 in_stack_fffffffffffffed8;
  half_t in_stack_fffffffffffffedc;
  read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>
  *in_stack_fffffffffffffee0;
  binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_std::error_code,_unsigned_long>
  *in_stack_fffffffffffffee8;
  binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_std::error_code,_unsigned_long>
  *in_stack_fffffffffffffef0;
  ptr *in_stack_ffffffffffffff00;
  
  handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
  ::handler_work((handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
                  *)in_stack_fffffffffffffee0,
                 (handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
                  *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_std::error_code,_unsigned_long>
  ::binder2(in_stack_fffffffffffffef0,&in_stack_fffffffffffffee8->handler_,
            (error_code *)in_stack_fffffffffffffee0,
            (unsigned_long *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  ptr::reset(in_stack_ffffffffffffff00);
  if (in_RDI != 0) {
    std_fenced_block::std_fenced_block
              ((std_fenced_block *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>,asio::any_io_executor,void>
    ::
    complete<asio::detail::binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,std::shared_ptr<nuraft::buffer>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,std::shared_ptr<nuraft::buffer>&,std::error_code,unsigned_long)>>,std::error_code,unsigned_long>>
              ((handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
                *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std_fenced_block::~std_fenced_block((std_fenced_block *)in_stack_fffffffffffffee8);
  }
  binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_std::error_code,_unsigned_long>
  ::~binder2((binder2<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_std::error_code,_unsigned_long>
              *)0x1ceaf9);
  handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
  ::~handler_work((handler_work<asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_all_t,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_std::shared_ptr<nuraft::buffer>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_std::shared_ptr<nuraft::buffer>_&,_std::error_code,_unsigned_long)>_>,_asio::any_io_executor,_void>
                   *)0x1ceb06);
  ptr::~ptr((ptr *)0x1ceb13);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_recv_op* o(static_cast<reactive_socket_recv_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }